

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uptime.c
# Opt level: O0

void test_calc_uptime_null(void **state)

{
  char *__ptr;
  char *uptime_str;
  
  _expect_string("__wrap_uptime","uptime_path",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O0/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
                 ,0xa3,"/proc/uptime",1);
  _will_return("__wrap_uptime",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O0/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
               ,0xa5,0,1);
  _will_return("__wrap_uptime",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O0/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
               ,0xa6,0,1);
  __ptr = calc_uptime();
  _assert_true((__ptr != (char *)0x0 ^ 0xffU) & 1,"uptime_str",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O0/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
               ,0xa9);
  free(__ptr);
  return;
}

Assistant:

static void test_calc_uptime_null(void **state)
{
    char *uptime_str = NULL;

    UNUSED(state);

    /* Make sure the passed 'in' argument is correct */
    expect_string(__wrap_uptime, uptime_path, "/proc/uptime");

    will_return(__wrap_uptime, -0.0);
    will_return(__wrap_uptime, 0.1);

    uptime_str = calc_uptime();
    assert_null(uptime_str);

    free(uptime_str);
}